

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

_Bool memequals(void *s1,void *s2,size_t n)

{
  uint uVar1;
  int iVar2;
  _Bool _Var3;
  
  if (n == 0) {
    _Var3 = true;
  }
  else {
    uVar1 = croaring_hardware_support();
    if ((uVar1 & 2) != 0) {
      _Var3 = _avx512_memequals(s1,s2,n);
      return _Var3;
    }
    if ((uVar1 & 1) != 0) {
      _Var3 = _avx2_memequals(s1,s2,n);
      return _Var3;
    }
    iVar2 = bcmp(s1,s2,n);
    _Var3 = iVar2 == 0;
  }
  return _Var3;
}

Assistant:

bool memequals(const void *s1, const void *s2, size_t n) {
    if (n == 0) {
        return true;
    }
#if CROARING_IS_X64
    int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (support & ROARING_SUPPORTS_AVX512) {
        return _avx512_memequals(s1, s2, n);
    } else
#endif  // CROARING_COMPILER_SUPPORTS_AVX512
        if (support & ROARING_SUPPORTS_AVX2) {
            return _avx2_memequals(s1, s2, n);
        } else {
            return memcmp(s1, s2, n) == 0;
        }
#else
    return memcmp(s1, s2, n) == 0;
#endif
}